

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callbacks.cpp
# Opt level: O0

IDeckLinkDeviceNotificationCallback *
cdecklink_internal_callback_create_deck_link_device_notification_callback
          (void *ctx,undefined1 *cb0,undefined1 *cb1)

{
  undefined1 *cb1_local;
  undefined1 *cb0_local;
  void *ctx_local;
  
  if ((cb0 == (undefined1 *)0x0) && (cb1 == (undefined1 *)0x0)) {
    ctx_local = (void *)0x0;
  }
  else {
    ctx_local = operator_new(0x28);
    DeckLinkDeviceNotificationCallback::DeckLinkDeviceNotificationCallback
              ((DeckLinkDeviceNotificationCallback *)ctx_local,ctx,cb0,cb1);
  }
  return (IDeckLinkDeviceNotificationCallback *)ctx_local;
}

Assistant:

IDeckLinkDeviceNotificationCallback* cdecklink_internal_callback_create_deck_link_device_notification_callback (void *ctx, cdecklink_device_notification_callback_deck_link_device_arrived *cb0, cdecklink_device_notification_callback_deck_link_device_removed *cb1) {
	if (cb0 != nullptr || cb1 != nullptr) {
		return new DeckLinkDeviceNotificationCallback(ctx, cb0, cb1);
	}
	return nullptr;
}